

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O3

void bit_move_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  m680x_reg mVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  
  lVar4 = (ulong)*address - (ulong)info->offset;
  if ((uint)lVar4 < info->size) {
    bVar3 = info->code[lVar4];
  }
  else {
    bVar3 = 0;
  }
  *address = *address + 1;
  mVar2 = bit_move_hdlr::m680x_reg[bVar3 >> 6];
  bVar1 = (info->m680x).op_count;
  bVar6 = bVar1 + 1;
  (info->m680x).op_count = bVar6;
  (info->m680x).operands[bVar1].type = M680X_OP_REGISTER;
  (info->m680x).operands[bVar1].field_1.reg = mVar2;
  (info->m680x).operands[bVar1].size = info->cpu->reg_byte_size[mVar2];
  (info->m680x).operands[bVar6].type = M680X_OP_CONSTANT;
  (info->m680x).operands[bVar6].field_1.direct_addr = bVar3 >> 3 & 7;
  (info->m680x).op_count = bVar1 + 3;
  uVar5 = (ulong)(bVar1 + 2) & 0xff;
  (info->m680x).operands[uVar5].type = M680X_OP_CONSTANT;
  (info->m680x).operands[uVar5].field_1.direct_addr = bVar3 & 7;
  direct_hdlr((MCInst *)(ulong)(bVar1 + 2),info,address);
  return;
}

Assistant:

static void bit_move_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	static const m680x_reg m680x_reg[] = {
		M680X_REG_CC, M680X_REG_A, M680X_REG_B, M680X_REG_INVALID,
	};

	uint8_t post_byte = 0;
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op;

	read_byte(info, &post_byte, *address);
	(*address)++;

	// operand[0] = register
	add_reg_operand(info, m680x_reg[post_byte >> 6]);

	// operand[1] = bit index in source operand
	op = &m680x->operands[m680x->op_count++];
	op->type = M680X_OP_CONSTANT;
	op->const_val = (post_byte >> 3) & 0x07;

	// operand[2] = bit index in destination operand
	op = &m680x->operands[m680x->op_count++];
	op->type = M680X_OP_CONSTANT;
	op->const_val = post_byte & 0x07;

	direct_hdlr(MI, info, address);
}